

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timsort.h
# Opt level: O1

void libxml_domnode_tim_sort_merge
               (xmlNodePtr *dst,TIM_SORT_RUN_T *stack,int stack_curr,TEMP_STORAGE_T *store)

{
  xmlNodePtr *__src;
  xmlNodePtr *ppxVar1;
  xmlNodePtr node2;
  void *pvVar2;
  void *pvVar3;
  int iVar4;
  long lVar5;
  xmlNodePtr *ppxVar6;
  xmlNodePtr pxVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  void *__size;
  ulong uVar12;
  
  lVar5 = (long)stack_curr;
  uVar8 = stack[lVar5 + -2].start;
  uVar10 = stack[lVar5 + -2].length;
  uVar12 = stack[lVar5 + -1].length;
  uVar9 = uVar12;
  if (uVar10 < uVar12) {
    uVar9 = uVar10;
  }
  if (store->alloc < uVar9) {
    __size = (void *)(uVar9 * 8);
    ppxVar6 = (xmlNodePtr *)realloc(store->storage,(size_t)__size);
    if (ppxVar6 == (xmlNodePtr *)0x0) {
      libxml_domnode_tim_sort_merge_cold_1();
      while (__size != (void *)0x0) {
        pvVar2 = *(void **)((long)__size + 0x20);
        if (*(long *)((long)__size + 8) != 0) {
          pvVar3 = *(void **)(*(long *)((long)__size + 8) + 8);
          if (pvVar3 != (void *)0x0) {
            (*xmlFree)(pvVar3);
          }
          (*xmlFree)(*(void **)((long)__size + 8));
        }
        (*xmlFree)(__size);
        __size = pvVar2;
      }
      return;
    }
    store->storage = ppxVar6;
    store->alloc = uVar9;
  }
  ppxVar6 = store->storage;
  if (uVar10 < uVar12) {
    __src = dst + uVar8;
    memcpy(ppxVar6,__src,uVar10 * 8);
    uVar11 = uVar8 + uVar10;
    uVar9 = uVar11 + uVar12;
    if (uVar8 < uVar9) {
      lVar5 = 0;
      uVar8 = 0;
      do {
        if ((uVar8 < uVar10) && (uVar11 < uVar9)) {
          pxVar7 = ppxVar6[uVar8];
          node2 = dst[uVar11];
          iVar4 = xmlXPathCmpNodesExt(pxVar7,node2);
          if (iVar4 == -2 || -1 < iVar4) {
            uVar8 = uVar8 + 1;
            __src[lVar5] = pxVar7;
          }
          else {
            uVar11 = uVar11 + 1;
            __src[lVar5] = node2;
          }
        }
        else {
          if (uVar10 <= uVar8) {
            return;
          }
          ppxVar1 = ppxVar6 + uVar8;
          uVar8 = uVar8 + 1;
          __src[lVar5] = *ppxVar1;
        }
        lVar5 = lVar5 + 1;
      } while (uVar12 + uVar10 != lVar5);
    }
  }
  else {
    uVar10 = uVar10 + uVar8;
    memcpy(ppxVar6,dst + uVar10,uVar12 * 8);
    uVar9 = uVar12 + uVar10;
    while (uVar8 < uVar9) {
      uVar9 = uVar9 - 1;
      if ((uVar12 == 0) || (uVar10 <= uVar8)) {
        if (uVar12 == 0) {
          return;
        }
        lVar5 = uVar12 - 1;
        uVar12 = uVar12 - 1;
        dst[uVar9] = ppxVar6[lVar5];
      }
      else {
        iVar4 = xmlXPathCmpNodesExt(dst[uVar10 - 1],ppxVar6[uVar12 - 1]);
        if (iVar4 < 0 && iVar4 != -2) {
          pxVar7 = dst[uVar10 - 1];
          uVar10 = uVar10 - 1;
        }
        else {
          pxVar7 = ppxVar6[uVar12 - 1];
          uVar12 = uVar12 - 1;
        }
        dst[uVar9] = pxVar7;
      }
    }
  }
  return;
}

Assistant:

static void TIM_SORT_MERGE(SORT_TYPE *dst, const TIM_SORT_RUN_T *stack, const int stack_curr,
                           TEMP_STORAGE_T *store) {
  const size_t A = stack[stack_curr - 2].length;
  const size_t B = stack[stack_curr - 1].length;
  const size_t curr = stack[stack_curr - 2].start;
  SORT_TYPE *storage;
  size_t i, j, k;
  TIM_SORT_RESIZE(store, MIN(A, B));
  storage = store->storage;

  /* left merge */
  if (A < B) {
    memcpy(storage, &dst[curr], A * sizeof(SORT_TYPE));
    i = 0;
    j = curr + A;

    for (k = curr; k < curr + A + B; k++) {
      if ((i < A) && (j < curr + A + B)) {
        if (SORT_CMP(storage[i], dst[j]) <= 0) {
          dst[k] = storage[i++];
        } else {
          dst[k] = dst[j++];
        }
      } else if (i < A) {
        dst[k] = storage[i++];
      } else {
        break;
      }
    }
  } else {
    /* right merge */
    memcpy(storage, &dst[curr + A], B * sizeof(SORT_TYPE));
    i = B;
    j = curr + A;
    k = curr + A + B;

    while (k > curr) {
      k--;
      if ((i > 0) && (j > curr)) {
        if (SORT_CMP(dst[j - 1], storage[i - 1]) > 0) {
          dst[k] = dst[--j];
        } else {
          dst[k] = storage[--i];
        }
      } else if (i > 0) {
        dst[k] = storage[--i];
      } else {
        break;
      }
    }
  }
}